

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

void TTD::NSSnapObjects::ParseAddtlInfo_SnapPromiseReactionTaskFunctionInfo
               (SnapObject *snpObject,FileReader *reader,SlabAllocator *alloc)

{
  SnapPromiseReactionTaskFunctionInfo *addtlInfo;
  TTDVar pvVar1;
  FileReader *reader_00;
  SnapPromiseReactionTaskFunctionInfo *rInfo;
  SlabAllocator *alloc_local;
  FileReader *reader_local;
  SnapObject *snpObject_local;
  
  addtlInfo = SlabAllocatorBase<0>::
              SlabAllocateStruct<TTD::NSSnapObjects::SnapPromiseReactionTaskFunctionInfo>(alloc);
  (*reader->_vptr_FileReader[3])(reader,3,1);
  pvVar1 = NSSnapValues::ParseTTDVar((NSSnapValues *)0x0,SUB81(reader,0),reader_00);
  addtlInfo->Argument = pvVar1;
  (*reader->_vptr_FileReader[3])(reader,7,1);
  NSSnapValues::ParsePromiseReactionInfo(&addtlInfo->Reaction,false,reader,alloc);
  SnapObjectSetAddtlInfoAs<TTD::NSSnapObjects::SnapPromiseReactionTaskFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)30>
            (snpObject,addtlInfo);
  return;
}

Assistant:

void ParseAddtlInfo_SnapPromiseReactionTaskFunctionInfo(SnapObject* snpObject, FileReader* reader, SlabAllocator& alloc)
        {
            SnapPromiseReactionTaskFunctionInfo* rInfo = alloc.SlabAllocateStruct<SnapPromiseReactionTaskFunctionInfo>();

            reader->ReadKey(NSTokens::Key::entry, true);
            rInfo->Argument = NSSnapValues::ParseTTDVar(false, reader);

            reader->ReadKey(NSTokens::Key::reaction, true);
            NSSnapValues::ParsePromiseReactionInfo(&rInfo->Reaction, false, reader, alloc);

            SnapObjectSetAddtlInfoAs<SnapPromiseReactionTaskFunctionInfo*, SnapObjectType::SnapPromiseReactionTaskFunctionObject>(snpObject, rInfo);
        }